

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvc.c
# Opt level: O3

err_t cvcExtr(int argc,char **argv)

{
  err_t eVar1;
  octet *cert;
  btok_cvc_t *cvc;
  size_t cert_len;
  size_t local_30;
  
  eVar1 = 0x25b;
  if ((argc == 2) && (eVar1 = cmdFileValExist(1,argv), eVar1 == 0)) {
    eVar1 = cmdFileValNotExist(1,argv + 1);
    if ((eVar1 == 0) && (eVar1 = cmdFileReadAll((void *)0x0,&local_30,*argv), eVar1 == 0)) {
      cert = (octet *)blobCreate(local_30 + 0x128);
      if (cert == (octet *)0x0) {
        eVar1 = 0x6e;
      }
      else {
        cvc = (btok_cvc_t *)(cert + local_30);
        eVar1 = cmdFileReadAll(cert,&local_30,*argv);
        if ((eVar1 == 0) && (eVar1 = btokCVCUnwrap(cvc,cert,local_30,(octet *)0x0,0), eVar1 == 0)) {
          eVar1 = cmdFileWrite(argv[1],cvc->pubkey,cvc->pubkey_len);
        }
        blobClose(cert);
      }
    }
  }
  return eVar1;
}

Assistant:

static err_t cvcExtr(int argc, char* argv[])
{
	err_t code;
	size_t cert_len;
	void* stack;
	octet* cert;
	btok_cvc_t* cvc;
	// обработать опции
	if (argc != 2)
		return ERR_CMD_PARAMS;
	// проверить наличие/отсутствие файлов
	code = cmdFileValExist(1, argv);
	ERR_CALL_CHECK(code);
	code = cmdFileValNotExist(1, argv + 1);
	ERR_CALL_CHECK(code);
	// определить длину сертификата
	code = cmdFileReadAll(0, &cert_len, argv[0]);
	ERR_CALL_CHECK(code);
	// выделить память и разметить ее
	code = cmdBlobCreate(stack, cert_len + sizeof(btok_cvc_t));
	ERR_CALL_CHECK(code);
	cert = (octet*)stack;
	cvc = (btok_cvc_t*)(cert + cert_len);
	// прочитать сертификат
	code = cmdFileReadAll(cert, &cert_len, argv[0]);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// разобрать сертификат
	code = btokCVCUnwrap(cvc, cert, cert_len, 0, 0);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// сохранить открытый ключ
	code = cmdFileWrite(argv[1], cvc->pubkey, cvc->pubkey_len);
	// завершить
	cmdBlobClose(stack);
	return code;
}